

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall
bench::show_to_console
          (bench *this,vector<bench::element,_std::allocator<bench::element>_> *current,string *name
          )

{
  size_t sVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  size_type __n;
  double *pdVar7;
  reference pvVar8;
  const_reference pvVar9;
  pointer this_00;
  unsigned_long *puVar10;
  reference this_01;
  reference this_02;
  char *format_str;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  color_type local_1a0;
  text_style local_198;
  color_type local_184;
  text_style local_17c;
  color_type local_168;
  text_style local_160;
  color_type local_14c;
  text_style local_144;
  size_type local_130;
  size_t end_solver_1;
  size_t solver_2;
  size_t end_solver;
  size_t solver_1;
  double upper;
  double lower;
  size_type local_f0;
  size_t i_2;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  pointer local_c8;
  size_t solver;
  model *local_b8;
  model *local_b0;
  __normal_iterator<const_bench::model_*,_std::vector<bench::model,_std::allocator<bench::model>_>_>
  local_a8;
  size_t local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long modelname_lenght_max;
  size_type sStack_80;
  int digits_1;
  size_t i_1;
  pointer piStack_70;
  int digits;
  size_t j;
  size_t i;
  int current_row_length;
  allocator<int> local_4d;
  value_type_conflict3 local_4c;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> row_length;
  size_type solver_size;
  size_type model_size;
  string *name_local;
  vector<bench::element,_std::allocator<bench::element>_> *current_local;
  bench *this_local;
  
  sVar6 = std::vector<bench::model,_std::allocator<bench::model>_>::size(&this->models);
  row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
  __n = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
  local_4c = 5;
  std::allocator<int>::allocator(&local_4d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,__n,&local_4c,&local_4d);
  std::allocator<int>::~allocator(&local_4d);
  i._0_4_ = 10;
  for (j = 0; j != sVar6; j = j + 1) {
    for (piStack_70 = (pointer)0x0;
        piStack_70 !=
        row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage; piStack_70 = (pointer)((long)piStack_70 + 1)) {
      pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,j,(index_type)piStack_70);
      bVar4 = is_valid(*pdVar7);
      if (bVar4) {
        pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,j,(index_type)piStack_70);
        iVar5 = get_digits_number(*pdVar7);
        i_1._4_4_ = iVar5;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,(size_type)piStack_70);
        iVar3 = i_1._4_4_;
        if (*pvVar8 < iVar5) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_48,(size_type)piStack_70);
          *pvVar8 = iVar3;
        }
      }
    }
  }
  for (sStack_80 = 0; sStack_80 != sVar6; sStack_80 = sStack_80 + 1) {
    pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                       (current,sStack_80);
    if ((pvVar9->success & 1U) != 0) {
      pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                         (current,sStack_80);
      bVar4 = is_valid(pvVar9->solution);
      if (bVar4) {
        pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                           (current,sStack_80);
        modelname_lenght_max._4_4_ = get_digits_number(pvVar9->solution);
        if ((int)i < modelname_lenght_max._4_4_) {
          i._0_4_ = modelname_lenght_max._4_4_;
        }
      }
    }
  }
  local_98 = 4;
  local_b0 = (model *)std::vector<bench::model,_std::allocator<bench::model>_>::cbegin
                                (&this->models);
  local_b8 = (model *)std::vector<bench::model,_std::allocator<bench::model>_>::cend(&this->models);
  local_a8 = std::
             max_element<__gnu_cxx::__normal_iterator<bench::model_const*,std::vector<bench::model,std::allocator<bench::model>>>,bench::show_to_console(std::vector<bench::element,std::allocator<bench::element>>const&,std::__cxx11::string)::_lambda(auto:1_const&,auto:2_const&)_1_>
                       (local_b0,local_b8);
  this_00 = __gnu_cxx::
            __normal_iterator<const_bench::model_*,_std::vector<bench::model,_std::allocator<bench::model>_>_>
            ::operator->(&local_a8);
  local_a0 = model::size(this_00);
  puVar10 = std::max<unsigned_long>(&local_98,&local_a0);
  local_90 = *puVar10;
  ::fmt::v7::print<char[10],char_const(&)[5],unsigned_long&,char>
            ((char (*) [10])"{:^{}} | ",(char (*) [5])0xc996b0,&local_90);
  for (local_c8 = (pointer)0x0;
      local_c8 !=
      row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage; local_c8 = (pointer)((long)local_c8 + 1)) {
    this_01 = std::vector<bench::solver,_std::allocator<bench::solver>_>::operator[]
                        (&this->solvers,(size_type)local_c8);
    _i_2 = bench::solver::name(this_01);
    bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)&i_2,0,10);
    local_d8 = bVar11;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(size_type)local_c8);
    ::fmt::v7::print<char[8],std::basic_string_view<char,std::char_traits<char>>,int&,char>
              ((char (*) [8])"{:>{}} ",&local_d8,pvVar8);
  }
  ::fmt::v7::print<char[8],std::__cxx11::string&,int&,char>((char (*) [8])"{:>{}}\n",name,(int *)&i)
  ;
  for (local_f0 = 0; local_f0 != sVar6; local_f0 = local_f0 + 1) {
    this_02 = std::vector<bench::model,_std::allocator<bench::model>_>::operator[]
                        (&this->models,local_f0);
    _lower = model::name(this_02);
    ::fmt::v7::
    print<char[10],std::basic_string_view<char,std::char_traits<char>>,unsigned_long&,char>
              ((char (*) [10])"{:^{}} | ",(basic_string_view<char,_std::char_traits<char>_> *)&lower
               ,&local_90);
    upper = std::numeric_limits<double>::max();
    solver_1 = (size_t)std::numeric_limits<double>::lowest();
    end_solver = 0;
    solver_2 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
    for (; end_solver != solver_2; end_solver = end_solver + 1) {
      pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver);
      bVar4 = is_valid(*pdVar7);
      dVar2 = upper;
      if (bVar4) {
        pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver);
        if (*pdVar7 < dVar2) {
          pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver);
          upper = *pdVar7;
        }
      }
      pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver);
      bVar4 = is_valid(*pdVar7);
      sVar1 = solver_1;
      if (bVar4) {
        pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver);
        if ((double)sVar1 < *pdVar7) {
          pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver);
          solver_1 = (size_t)*pdVar7;
        }
      }
    }
    pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                       (current,local_f0);
    if ((pvVar9->success & 1U) != 0) {
      pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                         (current,local_f0);
      bVar4 = is_valid(pvVar9->solution);
      dVar2 = upper;
      if (bVar4) {
        pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                           (current,local_f0);
        if (pvVar9->solution < dVar2) {
          pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                             (current,local_f0);
          upper = pvVar9->solution;
        }
      }
      pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                         (current,local_f0);
      bVar4 = is_valid(pvVar9->solution);
      sVar1 = solver_1;
      if (bVar4) {
        pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                           (current,local_f0);
        if ((double)sVar1 < pvVar9->solution) {
          pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                             (current,local_f0);
          solver_1 = (size_t)pvVar9->solution;
        }
      }
    }
    end_solver_1 = 0;
    local_130 = std::vector<bench::solver,_std::allocator<bench::solver>_>::size(&this->solvers);
    for (; end_solver_1 != local_130; end_solver_1 = end_solver_1 + 1) {
      pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver_1);
      if ((*pdVar7 != upper) || (NAN(*pdVar7) || NAN(upper))) {
        pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver_1);
        if ((*pdVar7 != (double)solver_1) || (NAN(*pdVar7) || NAN((double)solver_1))) {
          pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver_1);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_48,end_solver_1);
          ::fmt::v7::print<char[11],double&,int&,char>((char (*) [11])"{:>{}.3f} ",pdVar7,pvVar8);
        }
        else {
          ::fmt::v7::detail::color_type::color_type(&local_168,blue);
          ::fmt::v7::fg(&local_160,local_168);
          pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver_1);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_48,end_solver_1);
          ::fmt::v7::print<char[11],_double,_int,_0>
                    (&local_160,(char (*) [11])"{:>{}.3f} ",pdVar7,pvVar8);
        }
      }
      else {
        ::fmt::v7::detail::color_type::color_type(&local_14c,green);
        ::fmt::v7::fg(&local_144,local_14c);
        pdVar7 = baryonyx::dynamic_array<double>::operator()(&this->array,local_f0,end_solver_1);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_48,end_solver_1);
        ::fmt::v7::print<char[11],_double,_int,_0>
                  (&local_144,(char (*) [11])"{:>{}.3f} ",pdVar7,pvVar8);
      }
    }
    pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                       (current,local_f0);
    if ((pvVar9->solution != upper) || (NAN(pvVar9->solution) || NAN(upper))) {
      pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                         (current,local_f0);
      if ((pvVar9->solution != (double)solver_1) || (NAN(pvVar9->solution) || NAN((double)solver_1))
         ) {
        format_str = (char *)std::vector<bench::element,_std::allocator<bench::element>_>::
                             operator[](current,local_f0);
        ::fmt::v7::print<char[11],double_const&,int&,char>
                  ((char (*) [11])"{:>{}.3f} ",(double *)format_str,(int *)&i);
      }
      else {
        ::fmt::v7::detail::color_type::color_type(&local_1a0,blue);
        ::fmt::v7::fg(&local_198,local_1a0);
        pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                           (current,local_f0);
        format_str = "{:>{}.3f} ";
        ::fmt::v7::print<char[11],_double,_int,_0>
                  (&local_198,(char (*) [11])"{:>{}.3f} ",&pvVar9->solution,(int *)&i);
      }
    }
    else {
      ::fmt::v7::detail::color_type::color_type(&local_184,green);
      ::fmt::v7::fg(&local_17c,local_184);
      pvVar9 = std::vector<bench::element,_std::allocator<bench::element>_>::operator[]
                         (current,local_f0);
      format_str = "{:>{}.3f} ";
      ::fmt::v7::print<char[11],_double,_int,_0>
                (&local_17c,(char (*) [11])"{:>{}.3f} ",&pvVar9->solution,(int *)&i);
    }
    ::fmt::v7::print<char[2],,char>((v7 *)0xc9a94b,(char (*) [2])format_str);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return;
}

Assistant:

void show_to_console(const std::vector<element>& current, std::string name)
    {
        const auto model_size{ models.size() };
        const auto solver_size{ solvers.size() };

        std::vector<int> row_length(solvers.size(), 5);
        int current_row_length = { 10 };

        for (size_t i{ 0 }; i != model_size; ++i) {
            for (size_t j{ 0 }; j != solver_size; ++j) {
                if (is_valid(array(i, j))) {
                    auto digits = get_digits_number(array(i, j));

                    if (digits > row_length[j])
                        row_length[j] = digits;
                }
            }
        }

        for (size_t i{ 0 }; i != model_size; ++i) {
            if (current[i].success && is_valid(current[i].solution)) {
                auto digits = get_digits_number(current[i].solution);

                if (digits > current_row_length)
                    current_row_length = digits;
            }
        }

        auto modelname_lenght_max =
          std::max(static_cast<std::string::size_type>(4),
                   std::max_element(models.cbegin(),
                                    models.cend(),
                                    [](const auto& lhs, const auto& rhs) {
                                        return lhs.size() < rhs.size();
                                    })
                     ->size());

        fmt::print("{:^{}} | ", "file", modelname_lenght_max);

        for (std::size_t solver{ 0 }; solver != solver_size; ++solver)
            fmt::print("{:>{}} ",
                       solvers[solver].name().substr(0, 10),
                       row_length[solver]);

        fmt::print("{:>{}}\n", name, current_row_length);

        for (size_t i{ 0 }; i != model_size; ++i) {
            fmt::print("{:^{}} | ", models[i].name(), modelname_lenght_max);

            auto lower = std::numeric_limits<double>::max();
            auto upper = std::numeric_limits<double>::lowest();

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {
                if (is_valid(array(i, solver)) && lower > array(i, solver))
                    lower = array(i, solver);

                if (is_valid(array(i, solver)) && upper < array(i, solver))
                    upper = array(i, solver);
            }

            if (current[i].success) {
                if (is_valid(current[i].solution) &&
                    lower > current[i].solution)
                    lower = current[i].solution;

                if (is_valid(current[i].solution) &&
                    upper < current[i].solution)
                    upper = current[i].solution;
            }

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {

                if (array(i, solver) == lower)
                    fmt::print(fg(fmt::color::green),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else if (array(i, solver) == upper)
                    fmt::print(fg(fmt::color::blue),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else
                    fmt::print(
                      "{:>{}.3f} ", array(i, solver), row_length[solver]);
            }

            if (current[i].solution == lower)
                fmt::print(fg(fmt::color::green),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else if (current[i].solution == upper)
                fmt::print(fg(fmt::color::blue),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else
                fmt::print(
                  "{:>{}.3f} ", current[i].solution, current_row_length);

            fmt::print("\n");
        }
    }